

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng_ext.c
# Opt level: O3

int light_get_next_packet
              (light_pcapng_t *pcapng,light_packet_header *packet_header,uint8_t **packet_data)

{
  double dVar1;
  uint uVar2;
  light_pcapng_file_info *plVar3;
  uint16_t uVar4;
  light_pcapng p_Var5;
  uint *puVar6;
  light_option option;
  uint32_t *puVar7;
  ulong uVar8;
  long lVar9;
  undefined1 auVar10 [16];
  double dVar11;
  uint32_t type;
  _light_enhanced_packet_block *epb;
  int local_34;
  uint *local_30;
  
  local_34 = -0x21524111;
  if (pcapng->pcapng_iter == (light_pcapng)0x0) {
    return 0;
  }
  light_get_block_info(pcapng->pcapng_iter,LIGHT_INFO_TYPE,&local_34,(size_t *)0x0);
  p_Var5 = pcapng->pcapng_iter;
  if (((p_Var5 != (light_pcapng)0x0) && (local_34 != 6)) && (local_34 != 3)) {
    while( true ) {
      if (local_34 == 1) {
        __append_interface_block_to_file_info(p_Var5,pcapng->file_info);
        p_Var5 = pcapng->pcapng_iter;
      }
      p_Var5 = light_next_block(p_Var5);
      pcapng->pcapng_iter = p_Var5;
      if (p_Var5 == (light_pcapng)0x0) break;
      light_get_block_info(p_Var5,LIGHT_INFO_TYPE,&local_34,(size_t *)0x0);
      p_Var5 = pcapng->pcapng_iter;
      if (((p_Var5 == (light_pcapng)0x0) || (local_34 == 6)) || (local_34 == 3)) break;
    }
  }
  *packet_data = (uint8_t *)0x0;
  p_Var5 = pcapng->pcapng_iter;
  if (p_Var5 == (light_pcapng)0x0) {
    return 0;
  }
  if (local_34 == 3) {
    local_30 = (uint *)0x0;
    light_get_block_info(p_Var5,LIGHT_INFO_BODY,&local_30,(size_t *)0x0);
    packet_header->interface_id = 0;
    uVar2 = *local_30;
    packet_header->captured_length = uVar2;
    packet_header->original_length = uVar2;
    (packet_header->timestamp).tv_sec = 0;
    (packet_header->timestamp).tv_usec = 0;
    if (pcapng->file_info->interface_block_count != 0) {
      packet_header->data_link = pcapng->file_info->link_types[0];
    }
    puVar6 = local_30 + 1;
  }
  else {
    if (local_34 != 6) goto LAB_001030dd;
    local_30 = (uint *)0x0;
    light_get_block_info(p_Var5,LIGHT_INFO_BODY,&local_30,(size_t *)0x0);
    uVar8 = (ulong)*local_30;
    packet_header->interface_id = *local_30;
    uVar2 = local_30[4];
    packet_header->captured_length = local_30[3];
    packet_header->original_length = uVar2;
    auVar10._4_4_ = local_30[1];
    auVar10._0_4_ = local_30[2];
    plVar3 = pcapng->file_info;
    auVar10._8_4_ = local_30[1];
    auVar10._12_4_ = 0x45300000;
    dVar1 = plVar3->timestamp_resolution[uVar8];
    dVar11 = (auVar10._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,local_30[2]) - 4503599627370496.0);
    lVar9 = (long)(dVar1 * dVar11);
    (packet_header->timestamp).tv_sec = lVar9;
    (packet_header->timestamp).tv_usec =
         (long)((dVar11 - (double)lVar9 / dVar1) * dVar1 * 1000000.0);
    if (uVar8 < plVar3->interface_block_count) {
      packet_header->data_link = plVar3->link_types[uVar8];
    }
    puVar6 = local_30 + 5;
  }
  *packet_data = (uint8_t *)puVar6;
LAB_001030dd:
  packet_header->comment = (char *)0x0;
  packet_header->comment_length = 0;
  option = light_get_option(pcapng->pcapng_iter,1);
  if (option != (light_option)0x0) {
    uVar4 = light_get_option_length(option);
    packet_header->comment_length = uVar4;
    puVar7 = light_get_option_data(option);
    packet_header->comment = (char *)puVar7;
  }
  p_Var5 = light_next_block(pcapng->pcapng_iter);
  pcapng->pcapng_iter = p_Var5;
  return 1;
}

Assistant:

int light_get_next_packet(light_pcapng_t *pcapng, light_packet_header *packet_header, const uint8_t **packet_data)
{
	uint32_t type = LIGHT_UNKNOWN_DATA_BLOCK;

	if (pcapng->pcapng_iter == NULL)
		return 0;

	light_get_block_info(pcapng->pcapng_iter, LIGHT_INFO_TYPE, &type, NULL);

	while (pcapng->pcapng_iter != NULL && type != LIGHT_ENHANCED_PACKET_BLOCK && type != LIGHT_SIMPLE_PACKET_BLOCK)
	{
		if (type == LIGHT_INTERFACE_BLOCK)
			__append_interface_block_to_file_info(pcapng->pcapng_iter, pcapng->file_info);

		pcapng->pcapng_iter = light_next_block(pcapng->pcapng_iter);
		if (pcapng->pcapng_iter == NULL)
			break;
		light_get_block_info(pcapng->pcapng_iter, LIGHT_INFO_TYPE, &type, NULL);
	}

	*packet_data = NULL;

	if (pcapng->pcapng_iter == NULL)
		return 0;

	if (type == LIGHT_ENHANCED_PACKET_BLOCK)
	{
		struct _light_enhanced_packet_block *epb = NULL;

		light_get_block_info(pcapng->pcapng_iter, LIGHT_INFO_BODY, &epb, NULL);

		packet_header->interface_id = epb->interface_id;
		packet_header->captured_length = epb->capture_packet_length;
		packet_header->original_length = epb->original_capture_length;
		uint64_t timestamp = epb->timestamp_high;
		timestamp = timestamp << 32;
		timestamp += epb->timestamp_low;
		double timestamp_res = pcapng->file_info->timestamp_resolution[epb->interface_id];
		packet_header->timestamp.tv_sec = timestamp * timestamp_res;
		packet_header->timestamp.tv_usec = (timestamp - (packet_header->timestamp.tv_sec / timestamp_res))*timestamp_res*1000000;
		if (epb->interface_id < pcapng->file_info->interface_block_count)
			packet_header->data_link = pcapng->file_info->link_types[epb->interface_id];

		*packet_data = (uint8_t*)epb->packet_data;
	}

	else if (type == LIGHT_SIMPLE_PACKET_BLOCK)
	{
		struct _light_simple_packet_block *spb = NULL;

		light_get_block_info(pcapng->pcapng_iter, LIGHT_INFO_BODY, &spb, NULL);

		packet_header->interface_id = 0;
		packet_header->captured_length = spb->original_packet_length;
		packet_header->original_length = spb->original_packet_length;
		packet_header->timestamp.tv_sec = 0;
		packet_header->timestamp.tv_usec = 0;
		if (pcapng->file_info->interface_block_count > 0)
			packet_header->data_link = pcapng->file_info->link_types[0];

		*packet_data = (uint8_t*)spb->packet_data;
	}

	packet_header->comment = NULL;
	packet_header->comment_length = 0;

	light_option option = light_get_option(pcapng->pcapng_iter, 1); // get comment
	if (option != NULL)
	{
		packet_header->comment_length = light_get_option_length(option);
		packet_header->comment = (char*)light_get_option_data(option);
	}

	pcapng->pcapng_iter = light_next_block(pcapng->pcapng_iter);

	return 1;
}